

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataarray.h
# Opt level: O3

void __thiscall
soplex::DataArray<soplex::SoPlexBase<double>::RangeType>::insert
          (DataArray<soplex::SoPlexBase<double>::RangeType> *this,int i,int n)

{
  int iVar1;
  
  iVar1 = this->thesize;
  reSize(this,iVar1 + n);
  if (iVar1 - i != 0 && i <= iVar1) {
    memmove(this->data + (n + i),this->data + i,(ulong)(uint)(iVar1 - i) << 2);
    return;
  }
  return;
}

Assistant:

void insert(int i, int n)
   {
      int j = thesize;

      assert(i >= 0);
      assert(n >= 0);

      reSize(thesize + n);

      /// move \p n elements in memory from insert position \p i to the back
      if(j > i)
         memmove(&(data[i + n]), &(data[i]), (unsigned int)(j - i) * sizeof(T));
   }